

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_image_color(nk_context *ctx,nk_image img,nk_color col)

{
  nk_widget_layout_states nVar1;
  undefined1 local_30 [8];
  nk_rect bounds;
  nk_window *win;
  nk_context *ctx_local;
  nk_color col_local;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x4bf5,
                  "void nk_image_color(struct nk_context *, struct nk_image, struct nk_color)");
  }
  if (ctx->current == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x4bf6,
                  "void nk_image_color(struct nk_context *, struct nk_image, struct nk_color)");
  }
  if (ctx->current->layout == (nk_panel *)0x0) {
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x4bf7,
                  "void nk_image_color(struct nk_context *, struct nk_image, struct nk_color)");
  }
  if (((ctx != (nk_context *)0x0) && (ctx->current != (nk_window *)0x0)) &&
     (ctx->current->layout != (nk_panel *)0x0)) {
    bounds._8_8_ = ctx->current;
    nVar1 = nk_widget((nk_rect *)local_30,ctx);
    if (nVar1 != NK_WIDGET_INVALID) {
      nk_draw_image((nk_command_buffer *)(bounds._8_8_ + 0x68),_local_30,&img,col);
    }
  }
  return;
}

Assistant:

NK_API void
nk_image_color(struct nk_context *ctx, struct nk_image img, struct nk_color col)
{
    struct nk_window *win;
    struct nk_rect bounds;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout) return;

    win = ctx->current;
    if (!nk_widget(&bounds, ctx)) return;
    nk_draw_image(&win->buffer, bounds, &img, col);
}